

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O3

void fsnav_linal_kalman_predict_U_diag(double *x,double *S,double *U,double *q2,size_t n,size_t m)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  double *pdVar10;
  long lVar11;
  double dVar12;
  
  fsnav_linal_u_mul(x,U,x,n,1);
  if (n != 0) {
    lVar3 = n * 2;
    lVar1 = n * 2 + 1;
    lVar11 = n - 2;
    lVar4 = 0;
    uVar8 = 0;
    lVar9 = 0;
    do {
      uVar7 = uVar8;
      do {
        dVar12 = U[(lVar1 - uVar8) * uVar8 >> 1] * S[lVar9];
        S[lVar9] = dVar12;
        if (~uVar8 + n != 0) {
          uVar6 = lVar9 + ~uVar8 + n;
          pdVar10 = (double *)((long)U + lVar4 * 4 + 8);
          lVar2 = lVar11;
          while (uVar6 <= (lVar1 - uVar7) * uVar7 >> 1) {
            dVar12 = S[uVar6] * *pdVar10 + dVar12;
            S[lVar9] = dVar12;
            if (lVar2 == 0) break;
            pdVar10 = pdVar10 + 1;
            uVar6 = uVar6 + lVar2;
            lVar2 = lVar2 + -1;
          }
        }
        uVar7 = uVar7 + 1;
        lVar9 = lVar9 + 1;
      } while (uVar7 < n);
      uVar8 = uVar8 + 1;
      lVar11 = lVar11 + -1;
      lVar4 = lVar4 + lVar3;
      lVar3 = lVar3 + -2;
    } while (uVar8 != n);
  }
  fsnav_linal_uuT(S,S,n);
  if (m != 0) {
    lVar11 = n * 2 + 1;
    sVar5 = 0;
    do {
      uVar8 = lVar11 * sVar5 & 0xfffffffffffffffe;
      *(double *)((long)S + uVar8 * 4) = q2[sVar5] + *(double *)((long)S + uVar8 * 4);
      sVar5 = sVar5 + 1;
      lVar11 = lVar11 + -1;
    } while (m != sVar5);
  }
  fsnav_linal_chol(S,S,n);
  return;
}

Assistant:

void fsnav_linal_kalman_predict_U_diag(double* x, double* S, double* U, double* q2, const size_t n, const size_t m)
{
	size_t i, j, j1, k0, k1, k2, k, k10, j10;

	fsnav_linal_u_mul(x, U, x, n, 1);    // x = F*x  	
	for (i = 0, k0 = 0; i < n; i++) {
		k10 = i*(2*n-i+1)/2;            // start from the diagonal in U
		j10 = n-i-1;
		for (j = i; j < n; j++, k0++) {
			k1 = k10;
			S[k0] *= U[k1];             // S = F*S
			k2 = j*(2*n-j+1)/2;         // finish at the diagonal in S
			for (j1 = j10, k1++, k = k0+j1; j1 > 0 && k <= k2; j1--, k1++, k += j1)
				S[k0] += S[k]*U[k1];
		}
	}
	fsnav_linal_uuT(S, S, n);            // P = S*S^T
	for (i = 0; i < m; i++)
		S[i*(2*n-i+1)/2] += q2[i];      // P = P + Q, Q = [diag(q2) 0; 0 0]
	fsnav_linal_chol(S, S, n);           // P = S*S^T
}